

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::FBXConverter::GetUniqueName(FBXConverter *this,string *name,string *uniqueName)

{
  pointer ppVar1;
  uint *puVar2;
  ostream *poVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  pVar4;
  int local_264;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_260;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  local_238;
  string local_228 [32];
  int local_208;
  char local_201;
  ostringstream local_200 [8];
  ostringstream ext;
  uint *i;
  int local_5c;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  local_58;
  undefined1 local_30 [8];
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
  it_pair;
  string *uniqueName_local;
  string *name_local;
  FBXConverter *this_local;
  
  it_pair._8_8_ = uniqueName;
  std::__cxx11::string::operator=((string *)uniqueName,(string *)name);
  local_5c = 0;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<int,_true>(&local_58,name,&local_5c);
  pVar4 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
          ::insert(&this->mNodeNames,&local_58);
  local_30 = (undefined1  [8])pVar4.first._M_node;
  it_pair.first._M_node._0_1_ = pVar4.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::~pair(&local_58);
  ppVar1 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
           ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                         *)local_30);
  puVar2 = &ppVar1->second;
  while ((((byte)it_pair.first._M_node ^ 0xff) & 1) != 0) {
    *puVar2 = *puVar2 + 1;
    std::__cxx11::ostringstream::ostringstream(local_200);
    poVar3 = std::operator<<((ostream *)local_200,(string *)name);
    local_201 = (char)std::setfill<char>('0');
    poVar3 = std::operator<<(poVar3,local_201);
    local_208 = (int)std::setw(3);
    poVar3 = std::operator<<(poVar3,(_Setw)local_208);
    std::ostream::operator<<(poVar3,*puVar2);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)it_pair._8_8_,local_228);
    std::__cxx11::string::~string(local_228);
    local_264 = 0;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
              (&local_260,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)it_pair._8_8_,
               &local_264);
    pVar4 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::insert(&this->mNodeNames,&local_260);
    local_238.first = pVar4.first._M_node;
    local_238.second = pVar4.second;
    std::
    pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
    ::operator=((pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_bool>
                 *)local_30,&local_238);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(&local_260);
    std::__cxx11::ostringstream::~ostringstream(local_200);
  }
  return;
}

Assistant:

void FBXConverter::GetUniqueName(const std::string &name, std::string &uniqueName)
        {
            uniqueName = name;
            auto it_pair = mNodeNames.insert({ name, 0 }); // duplicate node name instance count
            unsigned int& i = it_pair.first->second;
            while (!it_pair.second)
            {
                i++;
                std::ostringstream ext;
                ext << name << std::setfill('0') << std::setw(3) << i;
                uniqueName = ext.str();
                it_pair = mNodeNames.insert({ uniqueName, 0 });
            }
        }